

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexReport.cpp
# Opt level: O1

void reportSimplexPhaseIterations
               (HighsLogOptions *log_options,HighsInt iteration_count,HighsSimplexInfo *info,
               bool initialise)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream iteration_report;
  undefined1 local_1a8 [376];
  
  if (info->run_quiet == false) {
    if (initialise) {
      info->iteration_count0 = iteration_count;
      info->dual_phase1_iteration_count0 = info->dual_phase1_iteration_count;
      info->dual_phase2_iteration_count0 = info->dual_phase2_iteration_count;
      info->primal_phase1_iteration_count0 = info->primal_phase1_iteration_count;
      info->primal_phase2_iteration_count0 = info->primal_phase2_iteration_count;
      info->primal_bound_swap0 = info->primal_bound_swap;
    }
    else {
      uVar13 = iteration_count - info->iteration_count0;
      iVar1 = info->dual_phase1_iteration_count;
      iVar2 = info->dual_phase2_iteration_count;
      iVar3 = info->dual_phase1_iteration_count0;
      uVar14 = iVar1 - iVar3;
      iVar4 = info->dual_phase2_iteration_count0;
      uVar17 = iVar2 - iVar4;
      iVar5 = info->primal_phase1_iteration_count;
      iVar6 = info->primal_phase1_iteration_count0;
      uVar16 = iVar5 - iVar6;
      iVar7 = info->primal_phase2_iteration_count;
      iVar8 = info->primal_phase2_iteration_count0;
      uVar12 = iVar7 - iVar8;
      uVar15 = uVar16 + uVar12 + uVar17 + uVar14;
      iVar9 = info->primal_bound_swap;
      iVar10 = info->primal_bound_swap0;
      if (uVar15 != uVar13) {
        highsLogUser(log_options,kError,"Iteration total error %d + %d + %d + %d = %d != %d\n",
                     (ulong)uVar14,(ulong)uVar17,(ulong)uVar16,(ulong)uVar12,(ulong)uVar15,
                     (ulong)uVar13);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&iteration_report);
      if (iVar1 != iVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"DuPh1 ",6);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; ",2);
      }
      if (iVar2 != iVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"DuPh2 ",6);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; ",2);
      }
      if (iVar5 != iVar6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"PrPh1 ",6);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; ",2);
      }
      if (iVar7 != iVar8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"PrPh2 ",6);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; ",2);
      }
      if (iVar9 != iVar10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"PrSwap ",7);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar9 - iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; ",2);
      }
      std::__cxx11::stringbuf::str();
      highsLogDev(log_options,kInfo,"Simplex iterations: %sTotal %d\n",local_1d8,(ulong)uVar13);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&iteration_report);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  return;
}

Assistant:

void reportSimplexPhaseIterations(const HighsLogOptions& log_options,
                                  const HighsInt iteration_count,
                                  HighsSimplexInfo& info,
                                  const bool initialise) {
  if (info.run_quiet) return;
  if (initialise) {
    info.iteration_count0 = iteration_count;
    info.dual_phase1_iteration_count0 = info.dual_phase1_iteration_count;
    info.dual_phase2_iteration_count0 = info.dual_phase2_iteration_count;
    info.primal_phase1_iteration_count0 = info.primal_phase1_iteration_count;
    info.primal_phase2_iteration_count0 = info.primal_phase2_iteration_count;
    info.primal_bound_swap0 = info.primal_bound_swap;
    return;
  }
  const HighsInt delta_iteration_count =
      iteration_count - info.iteration_count0;
  const HighsInt delta_dual_phase1_iteration_count =
      info.dual_phase1_iteration_count - info.dual_phase1_iteration_count0;
  const HighsInt delta_dual_phase2_iteration_count =
      info.dual_phase2_iteration_count - info.dual_phase2_iteration_count0;
  const HighsInt delta_primal_phase1_iteration_count =
      info.primal_phase1_iteration_count - info.primal_phase1_iteration_count0;
  const HighsInt delta_primal_phase2_iteration_count =
      info.primal_phase2_iteration_count - info.primal_phase2_iteration_count0;
  const HighsInt delta_primal_bound_swap =
      info.primal_bound_swap - info.primal_bound_swap0;

  HighsInt check_delta_iteration_count =
      delta_dual_phase1_iteration_count + delta_dual_phase2_iteration_count +
      delta_primal_phase1_iteration_count + delta_primal_phase2_iteration_count;
  if (check_delta_iteration_count != delta_iteration_count) {
    highsLogUser(
        log_options, HighsLogType::kError,
        "Iteration total error %" HIGHSINT_FORMAT " + %" HIGHSINT_FORMAT
        " + %" HIGHSINT_FORMAT " + %" HIGHSINT_FORMAT " = %" HIGHSINT_FORMAT
        " != %" HIGHSINT_FORMAT "\n",
        delta_dual_phase1_iteration_count, delta_dual_phase2_iteration_count,
        delta_primal_phase1_iteration_count,
        delta_primal_phase2_iteration_count, check_delta_iteration_count,
        delta_iteration_count);
  }
  std::stringstream iteration_report;
  if (delta_dual_phase1_iteration_count) {
    iteration_report << "DuPh1 " << delta_dual_phase1_iteration_count << "; ";
  }
  if (delta_dual_phase2_iteration_count) {
    iteration_report << "DuPh2 " << delta_dual_phase2_iteration_count << "; ";
  }
  if (delta_primal_phase1_iteration_count) {
    iteration_report << "PrPh1 " << delta_primal_phase1_iteration_count << "; ";
  }
  if (delta_primal_phase2_iteration_count) {
    iteration_report << "PrPh2 " << delta_primal_phase2_iteration_count << "; ";
  }
  if (delta_primal_bound_swap) {
    iteration_report << "PrSwap " << delta_primal_bound_swap << "; ";
  }

  highsLogDev(log_options, HighsLogType::kInfo,
              "Simplex iterations: %sTotal %" HIGHSINT_FORMAT "\n",
              iteration_report.str().c_str(), delta_iteration_count);
}